

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<kj::HashMap<int,_kj::String>::Entry>::setCapacity
          (Vector<kj::HashMap<int,_kj::String>::Entry> *this,size_t newSize)

{
  undefined4 *puVar1;
  StringPtr *pSVar2;
  RemoveConst<kj::StringPtr> *pRVar3;
  StringPtr *pSVar4;
  undefined4 *puVar5;
  __off_t in_RDX;
  ArrayBuilder<kj::StringPtr> local_38;
  
  if (newSize < (ulong)(*(long *)(this + 8) - *(long *)this >> 5)) {
    ArrayBuilder<kj::HashMap<int,_kj::String>::Entry>::truncate
              ((ArrayBuilder<kj::HashMap<int,_kj::String>::Entry> *)this,(char *)newSize,in_RDX);
  }
  local_38.ptr = (StringPtr *)
                 _::HeapArrayDisposer::allocateImpl
                           (0x20,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize * 2;
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  puVar1 = *(undefined4 **)(this + 8);
  local_38.pos = local_38.ptr;
  for (puVar5 = *(undefined4 **)this; puVar5 != puVar1; puVar5 = puVar5 + 8) {
    *(undefined4 *)&((local_38.pos)->content).ptr = *puVar5;
    ((local_38.pos)->content).size_ = *(size_t *)(puVar5 + 2);
    local_38.pos[1].content.ptr = *(char **)(puVar5 + 4);
    local_38.pos[1].content.size_ = *(size_t *)(puVar5 + 6);
    local_38.pos = local_38.pos + 2;
    *(undefined8 *)(puVar5 + 2) = 0;
    *(undefined8 *)(puVar5 + 4) = 0;
  }
  ArrayBuilder<kj::HashMap<int,_kj::String>::Entry>::operator=
            ((ArrayBuilder<kj::HashMap<int,_kj::String>::Entry> *)this,&local_38);
  pSVar4 = local_38.endPtr;
  pRVar3 = local_38.pos;
  pSVar2 = local_38.ptr;
  if (local_38.ptr != (StringPtr *)0x0) {
    local_38.ptr = (StringPtr *)0x0;
    local_38.pos = (RemoveConst<kj::StringPtr> *)0x0;
    local_38.endPtr = (StringPtr *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pSVar2,0x20,(long)pRVar3 - (long)pSVar2 >> 5,
               (long)pSVar4 - (long)pSVar2 >> 5,
               ArrayDisposer::Dispose_<kj::HashMap<int,_kj::String>::Entry>::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }